

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

void __thiscall soplex::SoPlexBase<double>::_syncLPReal(SoPlexBase<double> *this,bool time)

{
  byte in_SIL;
  SPxSolverBase<double> *in_RDI;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_fffffffffffffdf8;
  SLUFactorRational *in_stack_fffffffffffffe00;
  SPxLPBase<double> *lp;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_fffffffffffffe18;
  SPxLPBase<double> *in_stack_fffffffffffffe20;
  SPxLPBase<double> local_1d8;
  byte local_9;
  
  local_9 = in_SIL & 1;
  if (local_9 != 0) {
    (**(code **)(**(long **)&((in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                              super_SVSetBase<double>.set.theitem)->info + 0x18))();
  }
  if ((in_RDI[7].theRep & COLUMN) == ~ROW) {
    SPxLPBase<double>::operator=
              ((SPxLPBase<double> *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  }
  else {
    in_stack_fffffffffffffe00 =
         (SLUFactorRational *)
         &(in_RDI->super_SPxLPBase<double>).super_LPColSetBase<double>.scaleExp.data;
    lp = &local_1d8;
    SPxLPBase<double>::
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    SPxSolverBase<double>::loadLP(in_RDI,lp,SUB81((ulong)in_stack_fffffffffffffe00 >> 0x38,0));
    SPxLPBase<double>::~SPxLPBase((SPxLPBase<double> *)in_stack_fffffffffffffe00);
  }
  *(undefined1 *)
   &in_RDI[8].theTest.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = 0;
  SLUFactorRational::clear(in_stack_fffffffffffffe00);
  if ((local_9 & 1) != 0) {
    (**(code **)(**(long **)&((in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                              super_SVSetBase<double>.set.theitem)->info + 0x20))();
  }
  return;
}

Assistant:

void SoPlexBase<R>::_syncLPReal(bool time)
{
   // start timing
   if(time)
      _statistics->syncTime->start();

   // copy LP
   if(_isRealLPLoaded)
      _solver.loadLP((SPxLPBase<R>)(*_rationalLP));
   else
      *_realLP = *_rationalLP;

   ///@todo try loading old basis
   _hasBasis = false;
   _rationalLUSolver.clear();

   // stop timing
   if(time)
      _statistics->syncTime->stop();
}